

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O2

Tool * __thiscall
anon_unknown.dwarf_1fbd58::BuildFileImpl::getOrCreateTool
          (BuildFileImpl *this,StringRef name,Node *forNode)

{
  Tool *pTVar1;
  _Head_base<0UL,_llbuild::buildsystem::Tool_*,_false> _Var2;
  iterator iVar3;
  unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> *puVar4;
  _Head_base<0UL,_llbuild::buildsystem::Tool_*,_false> _Var5;
  pointer *__ptr;
  _Head_base<0UL,_llbuild::buildsystem::Tool_*,_false> local_a8;
  StringRef local_a0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  StringRef local_50;
  
  local_a0.Data = name.Data;
  local_a0.Length = name.Length;
  iVar3 = llvm::
          StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
          ::find(&this->tools,name);
  if (iVar3.
      super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
      .Ptr == (StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
               )((this->tools).super_StringMapImpl.TheTable +
                (this->tools).super_StringMapImpl.NumBuckets)) {
    (*this->delegate->_vptr_BuildFileDelegate[8])(&local_a8,this->delegate,name.Data,name.Length);
    _Var5._M_head_impl = local_a8._M_head_impl;
    if (local_a8._M_head_impl == (Tool *)0x0) {
      llvm::StringRef::str_abi_cxx11_(&local_90,&local_a0);
      std::operator+(&local_70,"invalid tool (",&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                     &local_70,") type in \'tools\' map");
      error(this,forNode,local_50);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    else {
      puVar4 = llvm::
               StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
               ::operator[](&this->tools,name);
      _Var2._M_head_impl = local_a8._M_head_impl;
      local_a8._M_head_impl = (Tool *)0x0;
      pTVar1 = (puVar4->_M_t).
               super___uniq_ptr_impl<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::buildsystem::Tool_*,_std::default_delete<llbuild::buildsystem::Tool>_>
               .super__Head_base<0UL,_llbuild::buildsystem::Tool_*,_false>._M_head_impl;
      (puVar4->_M_t).
      super___uniq_ptr_impl<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::buildsystem::Tool_*,_std::default_delete<llbuild::buildsystem::Tool>_>
      .super__Head_base<0UL,_llbuild::buildsystem::Tool_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (pTVar1 != (Tool *)0x0) {
        (*pTVar1->_vptr_Tool[1])();
      }
    }
    if (local_a8._M_head_impl != (Tool *)0x0) {
      (*(local_a8._M_head_impl)->_vptr_Tool[1])();
    }
  }
  else {
    _Var5._M_head_impl =
         *(Tool **)(*(long *)iVar3.
                             super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                             .Ptr + 8);
  }
  return _Var5._M_head_impl;
}

Assistant:

Tool* getOrCreateTool(StringRef name, llvm::yaml::Node* forNode) {
    // First, check the map.
    auto it = tools.find(name);
    if (it != tools.end())
      return it->second.get();
    
    // Otherwise, ask the delegate to create the tool.
    auto tool = delegate.lookupTool(name);
    if (!tool) {
      error(forNode, "invalid tool (" + name.str() +") type in 'tools' map");
      return nullptr;
    }
    auto result = tool.get();
    tools[name] = std::move(tool);

    return result;
  }